

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

bool arc::is(atom *a,atom *b)

{
  double dVar1;
  char cVar2;
  _func_error_vector<arc::atom,_std::allocator<arc::atom>_>_ptr_atom_ptr *p_Var3;
  _IO_FILE *p_Var4;
  __jmp_buf_tag (*pa_Var5) [1];
  shared_ptr<arc::cons> *__a;
  shared_ptr<arc::cons> *__b;
  shared_ptr<arc::closure> *__a_00;
  shared_ptr<arc::closure> *__b_00;
  _func_error_vector<arc::atom,_std::allocator<arc::atom>_>_ptr_atom_ptr **pp_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar7;
  double *pdVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *pcVar10;
  shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>
  *__a_01;
  shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>
  *__b_01;
  _IO_FILE **pp_Var11;
  __jmp_buf_tag (**ppa_Var12) [1];
  atom *b_local;
  atom *a_local;
  
  if (a->type == b->type) {
    switch(a->type) {
    case T_NIL:
      a_local._7_1_ = true;
      break;
    case T_CONS:
      __a = std::
            get<std::shared_ptr<arc::cons>,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                      (&a->val);
      __b = std::
            get<std::shared_ptr<arc::cons>,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                      (&b->val);
      a_local._7_1_ = std::operator==(__a,__b);
      break;
    case T_SYM:
      ppbVar7 = std::
                get<std::__cxx11::string*,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          (&a->val);
      pbVar9 = *ppbVar7;
      ppbVar7 = std::
                get<std::__cxx11::string*,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          (&b->val);
      a_local._7_1_ = pbVar9 == *ppbVar7;
      break;
    case T_NUM:
      pdVar8 = std::
               get<double,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&a->val);
      dVar1 = *pdVar8;
      pdVar8 = std::
               get<double,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&b->val);
      a_local._7_1_ = dVar1 == *pdVar8;
      break;
    case T_BUILTIN:
      pp_Var6 = __const_std__get<arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>_std__variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>const___
                          (&a->val);
      p_Var3 = *pp_Var6;
      pp_Var6 = __const_std__get<arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>_std__variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>const___
                          (&b->val);
      a_local._7_1_ = p_Var3 == *pp_Var6;
      break;
    case T_CLOSURE:
    case T_MACRO:
      __a_00 = std::
               get<std::shared_ptr<arc::closure>,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&a->val);
      __b_00 = std::
               get<std::shared_ptr<arc::closure>,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&b->val);
      a_local._7_1_ = std::operator==(__a_00,__b_00);
      break;
    case T_STRING:
      pbVar9 = atom::asp<std::__cxx11::string>(a);
      __rhs = atom::asp<std::__cxx11::string>(b);
      a_local._7_1_ = std::operator==(pbVar9,__rhs);
      break;
    case T_INPUT:
    case T_INPUT_PIPE:
    case T_OUTPUT:
      pp_Var11 = std::
                 get<_IO_FILE*,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                           (&a->val);
      p_Var4 = *pp_Var11;
      pp_Var11 = std::
                 get<_IO_FILE*,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                           (&b->val);
      a_local._7_1_ = p_Var4 == *pp_Var11;
      break;
    case T_TABLE:
      __a_01 = std::
               get<std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&a->val);
      __b_01 = std::
               get<std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&b->val);
      a_local._7_1_ = std::operator==(__a_01,__b_01);
      break;
    case T_CHAR:
      pcVar10 = std::
                get<char,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          (&a->val);
      cVar2 = *pcVar10;
      pcVar10 = std::
                get<char,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          (&b->val);
      a_local._7_1_ = cVar2 == *pcVar10;
      break;
    case T_CONTINUATION:
      ppa_Var12 = std::
                  get<__jmp_buf_tag_(*)[1],_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            (&a->val);
      pa_Var5 = *ppa_Var12;
      ppa_Var12 = std::
                  get<__jmp_buf_tag_(*)[1],_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                            (&b->val);
      a_local._7_1_ = pa_Var5 == *ppa_Var12;
      break;
    default:
      goto switchD_00179938_default;
    }
  }
  else {
switchD_00179938_default:
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool is(const atom& a, const atom& b) {
		if (a.type == b.type) {
			switch (a.type) {
			case T_NIL:
				return true;
			case T_CONS:
				return get<shared_ptr<struct cons>>(a.val) == get<shared_ptr<struct cons>>(b.val); // compare pointers
			case T_CLOSURE:
			case T_MACRO:
				return get<shared_ptr<struct closure>>(a.val) == get<shared_ptr<struct closure>>(b.val); // compare pointers
			case T_BUILTIN:
				return get<builtin>(a.val) == get<builtin>(b.val);
			case T_SYM:
				return get<sym>(a.val) == get<sym>(b.val);
			case T_NUM:
				return get<double>(a.val) == get<double>(b.val);
			case T_STRING:
				return a.asp<string>() == b.asp<string>();
			case T_CHAR:
				return get<char>(a.val) == get<char>(b.val);
			case T_TABLE:
				return get<shared_ptr<table>>(a.val) == get<shared_ptr<table>>(b.val); // compare pointers
			case T_INPUT:
			case T_INPUT_PIPE:
			case T_OUTPUT:
				return get<FILE*>(a.val) == get<FILE*>(b.val);
			case T_CONTINUATION:
				return get<jmp_buf*>(a.val) == get<jmp_buf*>(b.val);
			}
		}
		return false;
	}